

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_pcg_serial.c
# Opt level: O0

int check_flag(void *flagvalue,char *funcname,int opt)

{
  int *errflag;
  int opt_local;
  char *funcname_local;
  void *flagvalue_local;
  
  if ((opt == 0) && (flagvalue == (void *)0x0)) {
    fprintf(_stderr,"\nERROR: %s() failed - returned NULL pointer\n\n",funcname);
    flagvalue_local._4_4_ = 1;
  }
  else if ((opt == 1) && (*flagvalue != 0)) {
    fprintf(_stderr,"\nERROR: %s() failed with flag = %d\n\n",funcname,(ulong)*flagvalue);
    flagvalue_local._4_4_ = 1;
  }
  else {
    flagvalue_local._4_4_ = 0;
  }
  return flagvalue_local._4_4_;
}

Assistant:

static int check_flag(void *flagvalue, const char *funcname, int opt)
{
  int *errflag;

  /* Check if function returned NULL pointer - no memory allocated */
  if (opt==0 && flagvalue==NULL) {
    fprintf(stderr, "\nERROR: %s() failed - returned NULL pointer\n\n",
	    funcname);
    return 1; }

  /* Check if flag != 0 */
  if (opt==1) {
    errflag = (int *) flagvalue;
    if (*errflag != 0) {
      fprintf(stderr, "\nERROR: %s() failed with flag = %d\n\n",
	      funcname, *errflag);
      return 1; }}

  return 0;
}